

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

ssize_t __thiscall
lan::db::str_find_first_not_of(db *this,string *target,string *content,size_t spoint)

{
  char target_00;
  bool bVar1;
  db *pdVar2;
  
  while( true ) {
    if (content->_M_string_length <= spoint) {
      return -1;
    }
    target_00 = (content->_M_dataplus)._M_p[spoint];
    pdVar2 = (db *)&stack0xffffffffffffffb0;
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,(string *)target);
    bVar1 = str_compare(pdVar2,target_00,(string *)&stack0xffffffffffffffb0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    if (!bVar1) break;
    if ((content->_M_dataplus)._M_p[spoint] == '\"') {
      pdVar2 = (db *)&stack0xffffffffffffff90;
      std::__cxx11::string::string((string *)&stack0xffffffffffffff90,(string *)content);
      spoint = str_get_str_end(pdVar2,(string *)&stack0xffffffffffffff90,spoint + 1);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    }
    spoint = spoint + 1;
  }
  return spoint;
}

Assistant:

ssize_t db::str_find_first_not_of(std::string const target, const std::string content, size_t spoint){
            for(register_t i = spoint ; i < content.length() ; i ++){
                if(!str_compare(content.data()[i] ,target))
                    return i;
                if(content[i] == '\"')
                    i = str_get_str_end(content, i+1);
            } return -1;
        }